

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O2

uint __thiscall o3dgc::Arithmetic_Codec::stop_encoder(Arithmetic_Codec *this)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  if (this->mode != 1) {
    AC_Error("invalid to stop encoder");
  }
  this->mode = 0;
  bVar5 = 0x2000000 < this->length;
  uVar4 = 0x8000;
  if (bVar5) {
    uVar4 = 0x800000;
  }
  uVar3 = (uint)bVar5 * 0x800000 + 0x800000;
  puVar1 = &this->base;
  uVar2 = *puVar1;
  *puVar1 = *puVar1 + uVar3;
  this->length = uVar4;
  if (CARRY4(uVar2,uVar3)) {
    propagate_carry(this);
  }
  renorm_enc_interval(this);
  uVar4 = *(int *)&this->ac_pointer - *(int *)&this->code_buffer;
  if (uVar4 <= this->buffer_size) {
    return uVar4;
  }
  AC_Error("code buffer overflow");
}

Assistant:

unsigned Arithmetic_Codec::stop_encoder(void)
    {
      if (mode != 1) AC_Error("invalid to stop encoder");
      mode = 0;

      unsigned init_base = base;            // done encoding: set final data bytes

      if (length > 2 * AC__MinLength) {
        base  += AC__MinLength;                                     // base offset
        length = AC__MinLength >> 1;             // set new length for 1 more byte
      }
      else {
        base  += AC__MinLength >> 1;                                // base offset
        length = AC__MinLength >> 9;            // set new length for 2 more bytes
      }

      if (init_base > base) propagate_carry();                 // overflow = carry

      renorm_enc_interval();                // renormalization = output last bytes

      unsigned code_bytes = unsigned(ac_pointer - code_buffer);
      if (code_bytes > buffer_size) AC_Error("code buffer overflow");

      return code_bytes;                                   // number of bytes used
    }